

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseDecisionDag.cpp
# Opt level: O3

void __thiscall
slang::analysis::CaseDecisionDag::CaseDecisionDag
          (CaseDecisionDag *this,span<const_slang::SVInt,_18446744073709551615UL> clauses,
          uint32_t bitWidth,bool wildcardX,uint32_t maxSteps)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  size_t sVar4;
  group_type_pointer pgVar5;
  size_t sVar6;
  value_type_pointer puVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  SVInt curPath;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  ulong uVar14;
  __extent_storage<18446744073709551615UL> __n;
  ulong uVar15;
  ulong hash;
  group_type_pointer pgVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  value_type_conflict3 *elements_2;
  uint uVar21;
  bool bVar22;
  uchar uVar23;
  uchar uVar25;
  uchar uVar26;
  byte bVar27;
  int iVar28;
  undefined1 auVar24 [16];
  byte bVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar36 [16];
  span<const_slang::SVInt,_18446744073709551615UL> clauses_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *activeIndicesInput;
  ClauseIndex index;
  pointer local_e8;
  SVInt start;
  void *local_d0;
  uint local_c8;
  byte local_c3;
  ulong local_c0;
  value_type_pointer local_b8;
  group_type_pointer local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> activeIndices;
  locator res;
  
  __n = clauses._M_extent._M_extent_value;
  local_e8 = clauses._M_ptr;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_index = 0x3f;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_mask = 1;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.ml = 0;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.size = 0;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.groups_size_mask = 1;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .size_ctrl.ml = 0;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .size_ctrl.size = 0;
  (this->counterexample).super__Optional_base<slang::SVInt,_false,_false>._M_payload.
  super__Optional_payload<slang::SVInt,_true,_false,_false>.
  super__Optional_payload_base<slang::SVInt>._M_engaged = false;
  this->gaveUp = false;
  this->steps = 0;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .size_ctrl.ml = 0;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .size_ctrl.size = 0;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_index = 0x3f;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_mask = 1;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.ml = 0;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.size = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&activeIndices,__n._M_extent_value,(allocator_type *)&res);
  auVar30 = _DAT_004bff80;
  auVar29 = _DAT_004bff70;
  auVar10 = _DAT_0047c1a0;
  if (activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar14 = (long)activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
             (-4 - (long)activeIndices.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    auVar36._8_4_ = (int)uVar14;
    auVar36._0_8_ = uVar14;
    auVar36._12_4_ = (int)(uVar14 >> 0x20);
    auVar24._0_8_ = uVar14 >> 2;
    auVar24._8_8_ = auVar36._8_8_ >> 2;
    uVar15 = 0;
    auVar24 = auVar24 ^ _DAT_0047c1a0;
    do {
      uVar21 = (uint)uVar15;
      auVar35._8_4_ = uVar21;
      auVar35._0_8_ = uVar15;
      auVar35._12_4_ = (int)(uVar15 >> 0x20);
      auVar36 = (auVar35 | auVar30) ^ auVar10;
      iVar28 = auVar24._4_4_;
      if ((bool)(~(auVar36._4_4_ == iVar28 && auVar24._0_4_ < auVar36._0_4_ ||
                  iVar28 < auVar36._4_4_) & 1)) {
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = uVar21;
      }
      if ((auVar36._12_4_ != auVar24._12_4_ || auVar36._8_4_ <= auVar24._8_4_) &&
          auVar36._12_4_ <= auVar24._12_4_) {
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15 + 1] = uVar21 + 1;
      }
      auVar36 = (auVar35 | auVar29) ^ auVar10;
      iVar37 = auVar36._4_4_;
      if (iVar37 <= iVar28 && (iVar37 != iVar28 || auVar36._0_4_ <= auVar24._0_4_)) {
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15 + 2] = uVar21 + 2;
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15 + 3] = uVar21 + 3;
      }
      uVar15 = uVar15 + 4;
    } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar15);
  }
  SVInt::SVInt(&start,bitWidth,0,false);
  activeIndicesInput = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x45f1ae;
  SVInt::SVInt((SVInt *)&local_d0,&start.super_SVIntStorage);
  curPath.super_SVIntStorage._8_8_ = &activeIndices;
  curPath.super_SVIntStorage.field_0.pVal = (uint64_t *)&local_d0;
  clauses_00._M_extent._M_extent_value = __n._M_extent_value;
  clauses_00._M_ptr = local_e8;
  build(this,0,clauses_00,bitWidth,wildcardX,maxSteps,curPath,activeIndicesInput);
  if (((0x40 < local_c8) || ((local_c3 & 1) != 0)) && (local_d0 != (void *)0x0)) {
    operator_delete__(local_d0);
  }
  if (this->steps < maxSteps) {
    if (__n._M_extent_value != 0) {
      uVar14 = 0;
      do {
        index = (ClauseIndex)uVar14;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar14 & 0xffffffff;
        hash = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar11 = hash >> ((byte)(this->usedIndices).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                .arrays.groups_size_index & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        uVar15 = (this->usedIndices).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 .arrays.groups_size_mask;
        uVar18 = 0;
        do {
          pgVar2 = (this->usedIndices).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.groups_ + uVar11;
          bVar13 = pgVar2->m[0xf].n;
          uVar23 = (uchar)uVar3;
          auVar29[0] = -(pgVar2->m[0].n == uVar23);
          uVar25 = (uchar)((uint)uVar3 >> 8);
          auVar29[1] = -(pgVar2->m[1].n == uVar25);
          uVar26 = (uchar)((uint)uVar3 >> 0x10);
          auVar29[2] = -(pgVar2->m[2].n == uVar26);
          bVar27 = (byte)((uint)uVar3 >> 0x18);
          auVar29[3] = -(pgVar2->m[3].n == bVar27);
          auVar29[4] = -(pgVar2->m[4].n == uVar23);
          auVar29[5] = -(pgVar2->m[5].n == uVar25);
          auVar29[6] = -(pgVar2->m[6].n == uVar26);
          auVar29[7] = -(pgVar2->m[7].n == bVar27);
          auVar29[8] = -(pgVar2->m[8].n == uVar23);
          auVar29[9] = -(pgVar2->m[9].n == uVar25);
          auVar29[10] = -(pgVar2->m[10].n == uVar26);
          auVar29[0xb] = -(pgVar2->m[0xb].n == bVar27);
          auVar29[0xc] = -(pgVar2->m[0xc].n == uVar23);
          auVar29[0xd] = -(pgVar2->m[0xd].n == uVar25);
          auVar29[0xe] = -(pgVar2->m[0xe].n == uVar26);
          auVar29[0xf] = -(bVar13 == bVar27);
          for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar21 != 0;
              uVar21 = uVar21 - 1 & uVar21) {
            uVar8 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            if ((this->usedIndices).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                .arrays.elements_[uVar11 * 0xf + (ulong)uVar8] == index) goto LAB_0045f391;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar13) == 0) break;
          lVar12 = uVar11 + uVar18;
          uVar18 = uVar18 + 1;
          uVar11 = lVar12 + 1U & uVar15;
        } while (uVar18 <= uVar15);
        uVar18 = hash >> ((byte)(this->unreachableClauses).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                .arrays.groups_size_index & 0x3f);
        uVar15 = (this->unreachableClauses).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 .arrays.groups_size_mask;
        uVar19 = 0;
        uVar11 = uVar18;
        do {
          pgVar2 = (this->unreachableClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.groups_ + uVar11;
          bVar13 = pgVar2->m[0xf].n;
          auVar30[0] = -(pgVar2->m[0].n == uVar23);
          auVar30[1] = -(pgVar2->m[1].n == uVar25);
          auVar30[2] = -(pgVar2->m[2].n == uVar26);
          auVar30[3] = -(pgVar2->m[3].n == bVar27);
          auVar30[4] = -(pgVar2->m[4].n == uVar23);
          auVar30[5] = -(pgVar2->m[5].n == uVar25);
          auVar30[6] = -(pgVar2->m[6].n == uVar26);
          auVar30[7] = -(pgVar2->m[7].n == bVar27);
          auVar30[8] = -(pgVar2->m[8].n == uVar23);
          auVar30[9] = -(pgVar2->m[9].n == uVar25);
          auVar30[10] = -(pgVar2->m[10].n == uVar26);
          auVar30[0xb] = -(pgVar2->m[0xb].n == bVar27);
          auVar30[0xc] = -(pgVar2->m[0xc].n == uVar23);
          auVar30[0xd] = -(pgVar2->m[0xd].n == uVar25);
          auVar30[0xe] = -(pgVar2->m[0xe].n == uVar26);
          auVar30[0xf] = -(bVar13 == bVar27);
          for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); uVar21 != 0;
              uVar21 = uVar21 - 1 & uVar21) {
            uVar8 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            if ((this->unreachableClauses).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                .arrays.elements_[uVar11 * 0xf + (ulong)uVar8] == index) goto LAB_0045f391;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar13) == 0) break;
          lVar12 = uVar11 + uVar19;
          uVar19 = uVar19 + 1;
          uVar11 = lVar12 + 1U & uVar15;
        } while (uVar19 <= uVar15);
        if ((this->unreachableClauses).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            .size_ctrl.size <
            (this->unreachableClauses).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
          ::nosize_unchecked_emplace_at<unsigned_int_const&>
                    (&res,(table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                           *)this,(arrays_type *)this,uVar18,hash,&index);
          psVar1 = &(this->unreachableClauses).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
          ::unchecked_emplace_with_rehash<unsigned_int_const&>
                    (&res,(table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                           *)this,hash,&index);
        }
LAB_0045f391:
        uVar14 = uVar14 + 1;
      } while (uVar14 != __n._M_extent_value);
    }
    local_b8 = (this->overlappingClauses).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               .arrays.elements_;
    if (local_b8 != (value_type_pointer)0x0) {
      sVar4 = (this->overlappingClauses).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              .arrays.groups_size_mask;
      pgVar5 = (this->overlappingClauses).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               .arrays.groups_;
      if (pgVar5 != pgVar5 + sVar4 + 1) {
        local_e8 = (pointer)(this->overlappingClauses).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            .size_ctrl.size;
        sVar20 = (this->overlappingClauses).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 .size_ctrl.ml;
        sVar6 = (this->unreachableClauses).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                .arrays.groups_size_index;
        local_b0 = (this->unreachableClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.groups_;
        pgVar16 = pgVar5;
        do {
          auVar31[0] = -(pgVar16->m[0].n == '\0');
          auVar31[1] = -(pgVar16->m[1].n == '\0');
          auVar31[2] = -(pgVar16->m[2].n == '\0');
          auVar31[3] = -(pgVar16->m[3].n == '\0');
          auVar31[4] = -(pgVar16->m[4].n == '\0');
          auVar31[5] = -(pgVar16->m[5].n == '\0');
          auVar31[6] = -(pgVar16->m[6].n == '\0');
          auVar31[7] = -(pgVar16->m[7].n == '\0');
          auVar31[8] = -(pgVar16->m[8].n == '\0');
          auVar31[9] = -(pgVar16->m[9].n == '\0');
          auVar31[10] = -(pgVar16->m[10].n == '\0');
          auVar31[0xb] = -(pgVar16->m[0xb].n == '\0');
          auVar31[0xc] = -(pgVar16->m[0xc].n == '\0');
          auVar31[0xd] = -(pgVar16->m[0xd].n == '\0');
          auVar31[0xe] = -(pgVar16->m[0xe].n == '\0');
          auVar31[0xf] = -(pgVar16->m[0xf].n == '\0');
          uVar21 = ((uint)(pgVar5 + sVar4 != pgVar16) << 0xe | 0x3fff) &
                   ~(uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(auVar31[0xf] >> 7) << 0xf);
          if (uVar21 != 0) {
LAB_0045f449:
            uVar8 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            auVar10 = ZEXT416(local_b8[uVar8].first) * ZEXT816(0x9e3779b97f4a7c15);
            uVar15 = auVar10._8_8_ ^ auVar10._0_8_;
            bVar13 = (byte)sVar6;
            uVar14 = uVar15 >> (bVar13 & 0x3f);
            uVar3 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar15 & 0xff];
            local_c0 = (this->unreachableClauses).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       .arrays.groups_size_mask;
            puVar7 = (this->unreachableClauses).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     .arrays.elements_;
            uVar11 = 0;
            do {
              pgVar2 = local_b0 + uVar14;
              bVar27 = pgVar2->m[0xf].n;
              uVar23 = (uchar)uVar3;
              auVar33[0] = -(pgVar2->m[0].n == uVar23);
              uVar25 = (uchar)((uint)uVar3 >> 8);
              auVar33[1] = -(pgVar2->m[1].n == uVar25);
              uVar26 = (uchar)((uint)uVar3 >> 0x10);
              auVar33[2] = -(pgVar2->m[2].n == uVar26);
              bVar32 = (byte)((uint)uVar3 >> 0x18);
              auVar33[3] = -(pgVar2->m[3].n == bVar32);
              auVar33[4] = -(pgVar2->m[4].n == uVar23);
              auVar33[5] = -(pgVar2->m[5].n == uVar25);
              auVar33[6] = -(pgVar2->m[6].n == uVar26);
              auVar33[7] = -(pgVar2->m[7].n == bVar32);
              auVar33[8] = -(pgVar2->m[8].n == uVar23);
              auVar33[9] = -(pgVar2->m[9].n == uVar25);
              auVar33[10] = -(pgVar2->m[10].n == uVar26);
              auVar33[0xb] = -(pgVar2->m[0xb].n == bVar32);
              auVar33[0xc] = -(pgVar2->m[0xc].n == uVar23);
              auVar33[0xd] = -(pgVar2->m[0xd].n == uVar25);
              auVar33[0xe] = -(pgVar2->m[0xe].n == uVar26);
              auVar33[0xf] = -(bVar27 == bVar32);
              for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
                  uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
                uVar9 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                  }
                }
                if (puVar7[uVar14 * 0xf + (ulong)uVar9] == local_b8[uVar8].first) goto LAB_0045f5c8;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar27) == 0)
              break;
              lVar12 = uVar14 + uVar11;
              uVar11 = uVar11 + 1;
              uVar14 = lVar12 + 1U & local_c0;
            } while (uVar11 <= local_c0);
            auVar10 = ZEXT416(local_b8[uVar8].second) * ZEXT816(0x9e3779b97f4a7c15);
            uVar15 = auVar10._8_8_ ^ auVar10._0_8_;
            uVar14 = uVar15 >> (bVar13 & 0x3f);
            uVar3 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar15 & 0xff];
            uVar11 = 0;
            do {
              pgVar2 = local_b0 + uVar14;
              bVar13 = pgVar2->m[0xf].n;
              uVar23 = (uchar)uVar3;
              auVar34[0] = -(pgVar2->m[0].n == uVar23);
              uVar25 = (uchar)((uint)uVar3 >> 8);
              auVar34[1] = -(pgVar2->m[1].n == uVar25);
              uVar26 = (uchar)((uint)uVar3 >> 0x10);
              auVar34[2] = -(pgVar2->m[2].n == uVar26);
              bVar27 = (byte)((uint)uVar3 >> 0x18);
              auVar34[3] = -(pgVar2->m[3].n == bVar27);
              auVar34[4] = -(pgVar2->m[4].n == uVar23);
              auVar34[5] = -(pgVar2->m[5].n == uVar25);
              auVar34[6] = -(pgVar2->m[6].n == uVar26);
              auVar34[7] = -(pgVar2->m[7].n == bVar27);
              auVar34[8] = -(pgVar2->m[8].n == uVar23);
              auVar34[9] = -(pgVar2->m[9].n == uVar25);
              auVar34[10] = -(pgVar2->m[10].n == uVar26);
              auVar34[0xb] = -(pgVar2->m[0xb].n == bVar27);
              auVar34[0xc] = -(pgVar2->m[0xc].n == uVar23);
              auVar34[0xd] = -(pgVar2->m[0xd].n == uVar25);
              auVar34[0xe] = -(pgVar2->m[0xe].n == uVar26);
              auVar34[0xf] = -(bVar13 == bVar27);
              for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
                  uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
                uVar9 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                  }
                }
                if (puVar7[uVar14 * 0xf + (ulong)uVar9] == local_b8[uVar8].second)
                goto LAB_0045f5c8;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar13) == 0)
              break;
              lVar12 = uVar14 + uVar11;
              uVar11 = uVar11 + 1;
              uVar14 = lVar12 + 1U & local_c0;
            } while (uVar11 <= local_c0);
            goto LAB_0045f609;
          }
LAB_0045f616:
          local_b8 = local_b8 + 0xf;
          bVar22 = pgVar5 + sVar4 != pgVar16;
          pgVar16 = pgVar16 + 1;
        } while (bVar22);
      }
    }
  }
  else {
    this->gaveUp = true;
  }
  if (((0x40 < start.super_SVIntStorage.bitWidth) ||
      ((start.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
     (start.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__(start.super_SVIntStorage.field_0.pVal);
  }
  if (activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)activeIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)activeIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
LAB_0045f5c8:
  sVar20 = (sVar20 - 1) +
           (ulong)(((&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[pgVar16->m[uVar8].n & 7] &
                   *(byte *)((ulong)(pgVar16->m + uVar8) | 0xf)) == 0);
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .size_ctrl.ml = sVar20;
  pgVar16->m[uVar8].n = '\0';
  local_e8 = (pointer)&local_e8[-1].super_SVIntStorage.field_0xf;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .size_ctrl.size = (size_t)local_e8;
LAB_0045f609:
  uVar21 = uVar21 - 1 & uVar21;
  if (uVar21 == 0) goto LAB_0045f616;
  goto LAB_0045f449;
}

Assistant:

CaseDecisionDag::CaseDecisionDag(std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
                                 uint32_t maxSteps) {
    SLANG_ASSERT(bitWidth > 0);

    std::vector<ClauseIndex> activeIndices(clauses.size());
    std::iota(activeIndices.begin(), activeIndices.end(), 0);

#if defined(SLANG_DEBUG)
    for (auto& clause : clauses)
        SLANG_ASSERT(clause.getBitWidth() == bitWidth);
#endif

    SVInt start(bitWidth, 0, false);
    build(0, clauses, bitWidth, wildcardX, maxSteps, start, std::move(activeIndices));

    if (steps >= maxSteps) {
        gaveUp = true;
        return;
    }

    // Any clauses not used are marked as redundant.
    for (size_t i = 0; i < clauses.size(); i++) {
        auto index = (ClauseIndex)i;
        if (usedIndices.find(index) == usedIndices.end())
            unreachableClauses.insert(index);
    }

    // Remove overlapping clauses that are fully unreachable.
    erase_if(overlappingClauses, [&](const auto& pair) {
        return unreachableClauses.contains(pair.first) || unreachableClauses.contains(pair.second);
    });
}